

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

V1LayerParameter_LayerType caffe::UpgradeV0LayerType(string *type)

{
  bool bVar1;
  ostream *poVar2;
  string *type_local;
  
  bVar1 = std::operator==(type,"accuracy");
  if (bVar1) {
    type_local._4_4_ = V1LayerParameter_LayerType_ACCURACY;
  }
  else {
    bVar1 = std::operator==(type,"bnll");
    if (bVar1) {
      type_local._4_4_ = V1LayerParameter_LayerType_BNLL;
    }
    else {
      bVar1 = std::operator==(type,"concat");
      if (bVar1) {
        type_local._4_4_ = V1LayerParameter_LayerType_CONCAT;
      }
      else {
        bVar1 = std::operator==(type,"conv");
        if (bVar1) {
          type_local._4_4_ = V1LayerParameter_LayerType_CONVOLUTION;
        }
        else {
          bVar1 = std::operator==(type,"data");
          if (bVar1) {
            type_local._4_4_ = V1LayerParameter_LayerType_DATA;
          }
          else {
            bVar1 = std::operator==(type,"dropout");
            if (bVar1) {
              type_local._4_4_ = V1LayerParameter_LayerType_DROPOUT;
            }
            else {
              bVar1 = std::operator==(type,"euclidean_loss");
              if (bVar1) {
                type_local._4_4_ = V1LayerParameter_LayerType_EUCLIDEAN_LOSS;
              }
              else {
                bVar1 = std::operator==(type,"flatten");
                if (bVar1) {
                  type_local._4_4_ = V1LayerParameter_LayerType_FLATTEN;
                }
                else {
                  bVar1 = std::operator==(type,"hdf5_data");
                  if (bVar1) {
                    type_local._4_4_ = V1LayerParameter_LayerType_HDF5_DATA;
                  }
                  else {
                    bVar1 = std::operator==(type,"hdf5_output");
                    if (bVar1) {
                      type_local._4_4_ = V1LayerParameter_LayerType_HDF5_OUTPUT;
                    }
                    else {
                      bVar1 = std::operator==(type,"im2col");
                      if (bVar1) {
                        type_local._4_4_ = V1LayerParameter_LayerType_IM2COL;
                      }
                      else {
                        bVar1 = std::operator==(type,"images");
                        if (bVar1) {
                          type_local._4_4_ = V1LayerParameter_LayerType_IMAGE_DATA;
                        }
                        else {
                          bVar1 = std::operator==(type,"infogain_loss");
                          if (bVar1) {
                            type_local._4_4_ = V1LayerParameter_LayerType_INFOGAIN_LOSS;
                          }
                          else {
                            bVar1 = std::operator==(type,"innerproduct");
                            if (bVar1) {
                              type_local._4_4_ = V1LayerParameter_LayerType_INNER_PRODUCT;
                            }
                            else {
                              bVar1 = std::operator==(type,"lrn");
                              if (bVar1) {
                                type_local._4_4_ = V1LayerParameter_LayerType_LRN;
                              }
                              else {
                                bVar1 = std::operator==(type,"multinomial_logistic_loss");
                                if (bVar1) {
                                  type_local._4_4_ =
                                       V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS;
                                }
                                else {
                                  bVar1 = std::operator==(type,"pool");
                                  if (bVar1) {
                                    type_local._4_4_ = V1LayerParameter_LayerType_POOLING;
                                  }
                                  else {
                                    bVar1 = std::operator==(type,"relu");
                                    if (bVar1) {
                                      type_local._4_4_ = V1LayerParameter_LayerType_RELU;
                                    }
                                    else {
                                      bVar1 = std::operator==(type,"sigmoid");
                                      if (bVar1) {
                                        type_local._4_4_ = V1LayerParameter_LayerType_SIGMOID;
                                      }
                                      else {
                                        bVar1 = std::operator==(type,"softmax");
                                        if (bVar1) {
                                          type_local._4_4_ = V1LayerParameter_LayerType_SOFTMAX;
                                        }
                                        else {
                                          bVar1 = std::operator==(type,"softmax_loss");
                                          if (bVar1) {
                                            type_local._4_4_ =
                                                 V1LayerParameter_LayerType_SOFTMAX_LOSS;
                                          }
                                          else {
                                            bVar1 = std::operator==(type,"split");
                                            if (bVar1) {
                                              type_local._4_4_ = V1LayerParameter_LayerType_SPLIT;
                                            }
                                            else {
                                              bVar1 = std::operator==(type,"tanh");
                                              if (bVar1) {
                                                type_local._4_4_ = V1LayerParameter_LayerType_TANH;
                                              }
                                              else {
                                                bVar1 = std::operator==(type,"window_data");
                                                if (bVar1) {
                                                  type_local._4_4_ =
                                                       V1LayerParameter_LayerType_WINDOW_DATA;
                                                }
                                                else {
                                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                           "Unknown layer name: ");
                                                  std::operator<<(poVar2,(string *)type);
                                                  type_local._4_4_ = V1LayerParameter_LayerType_NONE
                                                  ;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

V1LayerParameter_LayerType UpgradeV0LayerType(const string& type) {
  if (type == "accuracy") {
    return V1LayerParameter_LayerType_ACCURACY;
  } else if (type == "bnll") {
    return V1LayerParameter_LayerType_BNLL;
  } else if (type == "concat") {
    return V1LayerParameter_LayerType_CONCAT;
  } else if (type == "conv") {
    return V1LayerParameter_LayerType_CONVOLUTION;
  } else if (type == "data") {
    return V1LayerParameter_LayerType_DATA;
  } else if (type == "dropout") {
    return V1LayerParameter_LayerType_DROPOUT;
  } else if (type == "euclidean_loss") {
    return V1LayerParameter_LayerType_EUCLIDEAN_LOSS;
  } else if (type == "flatten") {
    return V1LayerParameter_LayerType_FLATTEN;
  } else if (type == "hdf5_data") {
    return V1LayerParameter_LayerType_HDF5_DATA;
  } else if (type == "hdf5_output") {
    return V1LayerParameter_LayerType_HDF5_OUTPUT;
  } else if (type == "im2col") {
    return V1LayerParameter_LayerType_IM2COL;
  } else if (type == "images") {
    return V1LayerParameter_LayerType_IMAGE_DATA;
  } else if (type == "infogain_loss") {
    return V1LayerParameter_LayerType_INFOGAIN_LOSS;
  } else if (type == "innerproduct") {
    return V1LayerParameter_LayerType_INNER_PRODUCT;
  } else if (type == "lrn") {
    return V1LayerParameter_LayerType_LRN;
  } else if (type == "multinomial_logistic_loss") {
    return V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS;
  } else if (type == "pool") {
    return V1LayerParameter_LayerType_POOLING;
  } else if (type == "relu") {
    return V1LayerParameter_LayerType_RELU;
  } else if (type == "sigmoid") {
    return V1LayerParameter_LayerType_SIGMOID;
  } else if (type == "softmax") {
    return V1LayerParameter_LayerType_SOFTMAX;
  } else if (type == "softmax_loss") {
    return V1LayerParameter_LayerType_SOFTMAX_LOSS;
  } else if (type == "split") {
    return V1LayerParameter_LayerType_SPLIT;
  } else if (type == "tanh") {
    return V1LayerParameter_LayerType_TANH;
  } else if (type == "window_data") {
    return V1LayerParameter_LayerType_WINDOW_DATA;
  } else {
    LOG(FATAL) << "Unknown layer name: " << type;
    return V1LayerParameter_LayerType_NONE;
  }
}